

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

Node<QGesture_*,_QObject_*> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QGesture*,QObject*>>::findNode<QGesture*>
          (Data<QHashPrivate::Node<QGesture_*,_QObject_*>_> *this,QGesture **key)

{
  long lVar1;
  bool bVar2;
  Node<QGesture_*,_QObject_*> *pNVar3;
  QGesture **in_RDI;
  long in_FS_OFFSET;
  Bucket bucket;
  Data<QHashPrivate::Node<QGesture_*,_QObject_*>_> *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  findBucket<QGesture*>(in_stack_ffffffffffffffe0,in_RDI);
  bVar2 = Data<QHashPrivate::Node<QGesture_*,_QObject_*>_>::Bucket::isUnused((Bucket *)0x32e9bb);
  if (bVar2) {
    pNVar3 = (Node<QGesture_*,_QObject_*> *)0x0;
  }
  else {
    pNVar3 = Data<QHashPrivate::Node<QGesture_*,_QObject_*>_>::Bucket::node((Bucket *)0x32e9d6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar3;
  }
  __stack_chk_fail();
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }